

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service.hpp
# Opt level: O3

void __thiscall
asio::detail::reactive_socket_service<asio::ip::udp>::
async_receive_from<asio::mutable_buffers_1,ableton::util::SafeAsyncHandler<ableton::platforms::asio::Socket<512ul>::Impl>>
          (reactive_socket_service<asio::ip::udp> *this,implementation_type *impl,
          mutable_buffers_1 *buffers,endpoint_type *sender_endpoint,message_flags flags,
          SafeAsyncHandler<ableton::platforms::asio::Socket<512UL>::Impl> *handler)

{
  socket_type sVar1;
  size_t sVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  reactive_socket_recvfrom_op<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>,_ableton::util::SafeAsyncHandler<ableton::platforms::asio::Socket<512UL>::Impl>_>
  *op;
  error_category *peVar4;
  thread_info_base *this_thread;
  allocator_type a;
  long in_FS_OFFSET;
  ptr local_48;
  
  if (*(long *)(in_FS_OFFSET + -8) == 0) {
    this_thread = (thread_info_base *)0x0;
  }
  else {
    this_thread = *(thread_info_base **)(*(long *)(in_FS_OFFSET + -8) + 8);
  }
  local_48.h = handler;
  op = (reactive_socket_recvfrom_op<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>,_ableton::util::SafeAsyncHandler<ableton::platforms::asio::Socket<512UL>::Impl>_>
        *)thread_info_base::allocate(this_thread,0x70);
  sVar1 = (impl->super_base_implementation_type).socket_;
  (op->
  super_reactive_socket_recvfrom_op_base<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>_>
  ).super_reactor_op.super_operation.next_ = (scheduler_operation *)0x0;
  (op->
  super_reactive_socket_recvfrom_op_base<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>_>
  ).super_reactor_op.super_operation.func_ =
       reactive_socket_recvfrom_op<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>,_ableton::util::SafeAsyncHandler<ableton::platforms::asio::Socket<512UL>::Impl>_>
       ::do_complete;
  (op->
  super_reactive_socket_recvfrom_op_base<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>_>
  ).super_reactor_op.super_operation.task_result_ = 0;
  (op->
  super_reactive_socket_recvfrom_op_base<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>_>
  ).super_reactor_op.ec_._M_value = 0;
  local_48.v = op;
  peVar4 = (error_category *)std::_V2::system_category();
  (op->
  super_reactive_socket_recvfrom_op_base<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>_>
  ).super_reactor_op.ec_._M_cat = peVar4;
  (op->
  super_reactive_socket_recvfrom_op_base<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>_>
  ).super_reactor_op.bytes_transferred_ = 0;
  (op->
  super_reactive_socket_recvfrom_op_base<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>_>
  ).super_reactor_op.perform_func_ =
       reactive_socket_recvfrom_op_base<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>_>
       ::do_perform;
  (op->
  super_reactive_socket_recvfrom_op_base<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>_>
  ).socket_ = sVar1;
  (op->
  super_reactive_socket_recvfrom_op_base<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>_>
  ).protocol_type_ = 2;
  sVar2 = (buffers->super_mutable_buffer).size_;
  (op->
  super_reactive_socket_recvfrom_op_base<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>_>
  ).buffers_.super_mutable_buffer.data_ = (buffers->super_mutable_buffer).data_;
  (op->
  super_reactive_socket_recvfrom_op_base<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>_>
  ).buffers_.super_mutable_buffer.size_ = sVar2;
  (op->
  super_reactive_socket_recvfrom_op_base<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>_>
  ).sender_endpoint_ = sender_endpoint;
  (op->
  super_reactive_socket_recvfrom_op_base<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>_>
  ).flags_ = flags;
  p_Var3 = (handler->mpDelegate).
           super___weak_ptr<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (op->handler_).mpDelegate.
  super___weak_ptr<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (handler->mpDelegate).
         super___weak_ptr<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr;
  (op->handler_).mpDelegate.
  super___weak_ptr<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var3;
  (handler->mpDelegate).
  super___weak_ptr<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (handler->mpDelegate).
  super___weak_ptr<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_48.p = op;
  reactive_socket_service_base::start_op
            (&this->super_reactive_socket_service_base,&impl->super_base_implementation_type,
             flags * 2 & 2,(reactor_op *)op,false,true,false);
  local_48.v = (reactive_socket_recvfrom_op<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>,_ableton::util::SafeAsyncHandler<ableton::platforms::asio::Socket<512UL>::Impl>_>
                *)0x0;
  local_48.p = (reactive_socket_recvfrom_op<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>,_ableton::util::SafeAsyncHandler<ableton::platforms::asio::Socket<512UL>::Impl>_>
                *)0x0;
  reactive_socket_recvfrom_op<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>,_ableton::util::SafeAsyncHandler<ableton::platforms::asio::Socket<512UL>::Impl>_>
  ::ptr::reset(&local_48);
  return;
}

Assistant:

void async_receive_from(implementation_type& impl,
      const MutableBufferSequence& buffers, endpoint_type& sender_endpoint,
      socket_base::message_flags flags, Handler& handler)
  {
    bool is_continuation =
      asio_handler_cont_helpers::is_continuation(handler);

    // Allocate and construct an operation to wrap the handler.
    typedef reactive_socket_recvfrom_op<MutableBufferSequence,
        endpoint_type, Handler> op;
    typename op::ptr p = { asio::detail::addressof(handler),
      op::ptr::allocate(handler), 0 };
    int protocol = impl.protocol_.type();
    p.p = new (p.v) op(impl.socket_, protocol,
        buffers, sender_endpoint, flags, handler);

    ASIO_HANDLER_CREATION((reactor_.context(), *p.p, "socket",
          &impl, impl.socket_, "async_receive_from"));

    start_op(impl,
        (flags & socket_base::message_out_of_band)
          ? reactor::except_op : reactor::read_op,
        p.p, is_continuation, true, false);
    p.v = p.p = 0;
  }